

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O0

void corrupted_header_correct_superblock_test(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  anomalous_callbacks *doc_00;
  size_t __size;
  void *__ptr;
  uint8_t *filedata;
  uint64_t offset;
  int fd_dst;
  int fd;
  anomalous_callbacks *cbs;
  filemgr_ops *normal_ops;
  char valuebuf [256];
  char keybuf [256];
  fdb_status s;
  fdb_doc *doc;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int r;
  int j;
  int i;
  int n_commits;
  int n;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffb28;
  anomalous_callbacks *in_stack_fffffffffffffb30;
  size_t in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  size_t in_stack_fffffffffffffb60;
  undefined1 local_498 [248];
  filemgr_ops *local_3a0;
  char local_398 [104];
  fdb_kvs_config *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  fdb_kvs_handle **in_stack_fffffffffffffce0;
  fdb_file_handle *in_stack_fffffffffffffce8;
  fdb_config *in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd50;
  fdb_file_handle **in_stack_fffffffffffffd58;
  char local_298 [260];
  fdb_status local_194;
  fdb_doc *local_190;
  undefined1 local_170 [8];
  undefined8 local_168;
  fdb_kvs_handle *local_78;
  int local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  int local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_54 = 200;
  local_58 = 4;
  memleak_start();
  local_64 = system("rm -rf  anomaly_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_170,local_498,0xf8);
  local_168 = 0;
  fdb_get_default_kvs_config();
  doc_00 = get_default_anon_cbs();
  filemgr_ops_anomalous_init(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  local_3a0 = get_normal_ops_ptr();
  local_194 = fdb_open(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48
                      );
  if (local_194 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x33b);
    corrupted_header_correct_superblock_test::__test_pass = 0;
    if (local_194 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x33b,"void corrupted_header_correct_superblock_test()");
    }
  }
  local_194 = fdb_kvs_open(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                           in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  if (local_194 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
           );
    corrupted_header_correct_superblock_test::__test_pass = 0;
    if (local_194 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x33e,"void corrupted_header_correct_superblock_test()");
    }
  }
  local_60 = 0;
  do {
    if (local_58 <= (int)local_60) {
      local_194 = fdb_close(in_stack_fffffffffffffb28);
      if (local_194 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
               );
        corrupted_header_correct_superblock_test::__test_pass = 0;
        if (local_194 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x34e,"void corrupted_header_correct_superblock_test()");
        }
      }
      iVar1 = (*doc_00->open_cb)((void *)0x0,local_3a0,"anomaly_test1",2,0x1a4);
      iVar2 = (*doc_00->open_cb)((void *)0x0,local_3a0,"anomaly_test2",0x42,0x1a4);
      __size = (*doc_00->file_size_cb)((void *)0x0,local_3a0,"anomaly_test1");
      __ptr = malloc(__size);
      (*doc_00->pread_cb)((void *)0x0,local_3a0,iVar1,__ptr,__size,0);
      (*doc_00->pwrite_cb)((void *)0x0,local_3a0,iVar2,__ptr,__size - 0x1000,0);
      (*doc_00->close_cb)((void *)0x0,local_3a0,iVar1);
      (*doc_00->close_cb)((void *)0x0,local_3a0,iVar2);
      free(__ptr);
      local_194 = fdb_open(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                           in_stack_fffffffffffffd48);
      if (local_194 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x35e);
        corrupted_header_correct_superblock_test::__test_pass = 0;
        if (local_194 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x35e,"void corrupted_header_correct_superblock_test()");
        }
      }
      local_194 = fdb_kvs_open(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                               in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      if (local_194 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x361);
        corrupted_header_correct_superblock_test::__test_pass = 0;
        if (local_194 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x361,"void corrupted_header_correct_superblock_test()");
        }
      }
      local_60 = 2;
      local_5c = 0;
      while( true ) {
        if (local_54 <= (int)local_5c) {
          local_194 = fdb_close(in_stack_fffffffffffffb28);
          if (local_194 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x370);
            corrupted_header_correct_superblock_test::__test_pass = 0;
            if (local_194 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                            ,0x370,"void corrupted_header_correct_superblock_test()");
            }
          }
          fdb_shutdown();
          memleak_end();
          if (corrupted_header_correct_superblock_test::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","corrupted DB header from correct superblock test");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","corrupted DB header from correct superblock test");
          }
          return;
        }
        sprintf(local_298,"k%06d",(ulong)local_5c);
        sprintf(local_398,"v%d_%04d",(ulong)local_60,(ulong)local_5c);
        in_stack_fffffffffffffb28 = (fdb_file_handle *)0x0;
        fdb_doc_create((fdb_doc **)doc_00,(void *)CONCAT44(iVar1,iVar2),__size,__ptr,0,
                       (void *)0x109adf,in_stack_fffffffffffffb60);
        local_194 = fdb_get(local_78,local_190);
        if (local_194 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x36a);
          corrupted_header_correct_superblock_test::__test_pass = 0;
          if (local_194 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                          ,0x36a,"void corrupted_header_correct_superblock_test()");
          }
        }
        iVar3 = memcmp(local_190->body,local_398,local_190->bodylen);
        if (iVar3 != 0) break;
        fdb_doc_free((fdb_doc *)0x109bf9);
        local_5c = local_5c + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_398,local_190->body,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x36b);
      corrupted_header_correct_superblock_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x36b,"void corrupted_header_correct_superblock_test()");
    }
    for (local_5c = 0; (int)local_5c < local_54; local_5c = local_5c + 1) {
      sprintf(local_298,"k%06d",(ulong)local_5c);
      sprintf(local_398,"v%d_%04d",(ulong)local_60,(ulong)local_5c);
      in_stack_fffffffffffffb28 = (fdb_file_handle *)0x8;
      fdb_doc_create((fdb_doc **)doc_00,
                     (void *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,8,(void *)0x10965f,
                     in_stack_fffffffffffffb60);
      local_194 = fdb_set(local_78,local_190);
      if (local_194 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
               );
        corrupted_header_correct_superblock_test::__test_pass = 0;
        if (local_194 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x346,"void corrupted_header_correct_superblock_test()");
        }
      }
      fdb_doc_free((fdb_doc *)0x1096ed);
    }
    local_194 = fdb_commit(in_stack_fffffffffffffb28,'\0');
    if (local_194 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
             );
      corrupted_header_correct_superblock_test::__test_pass = 0;
      if (local_194 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x34a,"void corrupted_header_correct_superblock_test()");
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void corrupted_header_correct_superblock_test()
{
    TEST_INIT();
    int n=200, n_commits=4, i, j, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[256];
    struct filemgr_ops *normal_ops;

    memleak_start();

    // remove previous dummy files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    kvs_config = fdb_get_default_kvs_config();

    struct anomalous_callbacks *cbs = get_default_anon_cbs();
    filemgr_ops_anomalous_init(cbs, NULL);

    normal_ops = get_normal_ops_ptr();

    // create a file
    s = fdb_open(&dbfile, "anomaly_test1", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    for (j=0; j<n_commits; ++j) {
        for (i=0; i<n; ++i) {
            sprintf(keybuf, "k%06d", i);
            sprintf(valuebuf, "v%d_%04d", j, i);
            fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 8);
            s = fdb_set(db, doc);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            fdb_doc_free(doc);
        }
        s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // copy the data in the file except for the last (header) block
    int fd = cbs->open_cb(NULL, normal_ops, "anomaly_test1", O_RDWR, 0644);
    int fd_dst = cbs->open_cb(NULL, normal_ops,
                              "anomaly_test2", O_CREAT | O_RDWR, 0644);
    uint64_t offset = cbs->file_size_cb(NULL, normal_ops, "anomaly_test1");
    uint8_t *filedata = (uint8_t*)malloc(offset);
    cbs->pread_cb(NULL, normal_ops, fd, (void*)filedata, offset, 0);
    cbs->pwrite_cb(NULL, normal_ops, fd_dst, (void*)filedata, offset - 4096, 0);
    cbs->close_cb(NULL, normal_ops, fd);
    cbs->close_cb(NULL, normal_ops, fd_dst);
    free(filedata);

    // open the corrupted file
    s = fdb_open(&dbfile, "anomaly_test2", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // data at the 3rd commit should be read
    j = 2;
    for (i=0; i<n; ++i) {
        sprintf(keybuf, "k%06d", i);
        sprintf(valuebuf, "v%d_%04d", j, i);
        fdb_doc_create(&doc, keybuf, 8, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(doc->body, valuebuf, doc->bodylen);
        fdb_doc_free(doc);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_shutdown();
    memleak_end();

    TEST_RESULT("corrupted DB header from correct superblock test");
}